

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

bool __thiscall asl::HttpMessage::hasHeader(HttpMessage *this,String *name)

{
  bool bVar1;
  String SStack_28;
  
  capitalized(&SStack_28,name);
  bVar1 = Map<asl::String,_asl::String>::has
                    (&(this->_headers).super_Map<asl::String,_asl::String>,&SStack_28);
  String::~String(&SStack_28);
  return bVar1;
}

Assistant:

bool HttpMessage::hasHeader(const String& name) const
{
	return _headers.has(capitalized(name));
}